

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

optional<Vault::AuthenticationResponse> * __thiscall
SuccessfulAuth::authenticate
          (optional<Vault::AuthenticationResponse> *__return_storage_ptr__,SuccessfulAuth *this,
          Client *client)

{
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  AuthenticationResponse local_60;
  Client *local_20;
  Client *client_local;
  SuccessfulAuth *this_local;
  
  local_20 = client;
  client_local = (Client *)this;
  this_local = (SuccessfulAuth *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_81);
  Vault::
  Tiny<Vault::HttpResponseBodyStringDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_60.rawResponse,&local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"success",&local_b9);
  Vault::
  Tiny<Vault::TokenDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_60.token,&local_b8);
  Catch::clara::std::optional<Vault::AuthenticationResponse>::
  optional<Vault::AuthenticationResponse,_true>(__return_storage_ptr__,&local_60);
  Vault::AuthenticationResponse::~AuthenticationResponse(&local_60);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::AuthenticationResponse>
  authenticate(const Vault::Client &client) override {
    return std::optional<Vault::AuthenticationResponse>(
        {Vault::HttpResponseBodyString{""}, Vault::Token{"success"}});
  }